

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O2

uchar * __thiscall
density::
sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
::consume_operation::element<unsigned_char>(consume_operation *this)

{
  runtime_type<> *prVar1;
  uchar *puVar2;
  
  if (0xf < (this->m_consume_data).m_next_ptr) {
    prVar1 = complete_type(this);
    if (prVar1->m_feature_table ==
        (tuple_type *)
        detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,unsigned_char>
        ::s_table) goto LAB_011b2c89;
  }
  density_tests::detail::assert_failed<>
            ("!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>()",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/sp_heter_queue.h"
             ,0x48a);
LAB_011b2c89:
  puVar2 = (uchar *)detail::
                    LFQueue_Base<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
                    ::get_element((this->m_consume_data).m_control,
                                  SUB41(((uint)(this->m_consume_data).m_next_ptr & 4) >> 2,0));
  return puVar2;
}

Assistant:

COMPLETE_ELEMENT_TYPE & element() const noexcept
            {
                DENSITY_ASSERT(!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>());
                return *static_cast<COMPLETE_ELEMENT_TYPE *>(
                  Base::get_element(m_consume_data.m_control, m_consume_data.external()));
            }